

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(char lhs,SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> u;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> local_d;
  uint local_c;
  
  local_c = 0;
  local_d = (SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>)lhs;
  u = SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                (&local_d,rhs.m_int);
  SafeCastHelper<unsigned_int,_signed_char,_1>::
  CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(u.m_int,&local_c);
  return (SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_c;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}